

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc1.c
# Opt level: O3

void mbc1_write(gb_cart *cart,uint16_t addr,uint8_t byte)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  
  if (cart == (gb_cart *)0x0) {
    __assert_fail("cart != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc1.c"
                  ,0x5b,"void mbc1_write(struct gb_cart *, uint16_t, uint8_t)");
  }
  if (addr >> 0xc < 0xc) {
    pcVar1 = (char *)cart->mbc_state;
    switch(addr >> 0xc) {
    default:
      *pcVar1 = (byte & 0xf) == 10;
      return;
    case 2:
    case 3:
      uVar2 = (int)((uint)(byte & 0x1f) | cart->curr_rom_bank & 0xffffffe0U) % cart->rom_size;
      cart->curr_rom_bank = uVar2;
      switch(uVar2 << 0x1b | uVar2 >> 5) {
      case 0:
switchD_00105c72_caseD_0:
        cart->curr_rom_bank = 1;
        return;
      case 1:
switchD_00105c72_caseD_1:
        cart->curr_rom_bank = 0x21;
        return;
      case 2:
switchD_00105c72_caseD_2:
        cart->curr_rom_bank = 0x41;
        return;
      case 3:
switchD_00105c72_caseD_3:
        cart->curr_rom_bank = 0x61;
        return;
      }
      break;
    case 4:
    case 5:
      if (pcVar1[1] != '\x01') {
        cart->curr_ram_bank = (int)((long)(ulong)byte % (long)cart->ram_size);
        return;
      }
      uVar2 = (uint)((long)(ulong)((byte)(byte << 5) & 0x60 | cart->curr_rom_bank & 0x1fU) %
                    (long)cart->rom_size);
      cart->curr_rom_bank = uVar2;
      switch(uVar2 << 0x1b | uVar2 >> 5) {
      case 0:
        goto switchD_00105c72_caseD_0;
      case 1:
        goto switchD_00105c72_caseD_1;
      case 2:
        goto switchD_00105c72_caseD_2;
      case 3:
        goto switchD_00105c72_caseD_3;
      }
      break;
    case 6:
    case 7:
      pcVar1[1] = byte & 1;
      return;
    case 8:
    case 9:
      break;
    case 10:
    case 0xb:
      if (*pcVar1 == '\x01') {
        iVar3 = 0;
        if (pcVar1[1] == '\0') {
          iVar3 = cart->curr_ram_bank << 0xd;
        }
        cart->ram[(long)(int)(iVar3 + (uint)addr) + -0xa000] = byte;
      }
    }
  }
  return;
}

Assistant:

void mbc1_write(struct gb_cart *cart, uint16_t addr, uint8_t byte)
{
    assert(cart != NULL);

    mbc1_state_t *state = (mbc1_state_t*)cart->mbc_state;

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
        // RAM enable
        state->ram_enabled = (byte & 0xF) == 0xA;
        break;

    case 0x2000:
    case 0x3000:
        // ROM bank number
        cart->curr_rom_bank = (cart->curr_rom_bank & (~0x1F)) | (byte & 0x1F);
        cart->curr_rom_bank %= cart->rom_size;

        switch (cart->curr_rom_bank)
        {
        case 0x00:
            cart->curr_rom_bank = 0x01;
            break;
        
        case 0x20:
            cart->curr_rom_bank = 0x21;
            break;

        case 0x40:
            cart->curr_rom_bank = 0x41;
            break;

        case 0x60:
            cart->curr_rom_bank = 0x61;
            break;

        default:
            break;
        }

        break;

    case 0x4000:
    case 0x5000:
        //  RAM Bank Number (mode 0) or Upper Bits of ROM Bank Number (mode 1)
        if (state->second_mode)
        {
            cart->curr_rom_bank = (cart->curr_rom_bank & 0x1F) | ((byte & 0x3) << 5);
            cart->curr_rom_bank %= cart->rom_size;

            switch (cart->curr_rom_bank)
            {
            case 0x00:
                cart->curr_rom_bank = 0x01;
                break;
            
            case 0x20:
                cart->curr_rom_bank = 0x21;
                break;

            case 0x40:
                cart->curr_rom_bank = 0x41;
                break;

            case 0x60:
                cart->curr_rom_bank = 0x61;
                break;

            default:
                break;
            }
        }
        else
        {
            cart->curr_ram_bank = byte;
            cart->curr_ram_bank %= cart->ram_size;
        }

        break;

    case 0x6000:
    case 0x7000:
        // Mode switching
        state->second_mode = byte & 0x1;
        break;

    case 0xA000:
    case 0xB000:
        // External RAM
        if (state->ram_enabled)
        {
            int offset = 0;
            if (!state->second_mode)
                offset = cart->curr_ram_bank * SRAM_BANK_SIZE;

            cart->ram[offset + addr - 0xA000] = byte;
        }
        break;
    
    default:
        break;
    }
}